

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Identifier.h
# Opt level: O2

void __thiscall
soul::TokenisedPathString::TokenisedPathString(TokenisedPathString *this,string *path)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  Section local_40;
  
  std::__cxx11::string::string((string *)this,(string *)path);
  (this->sections).items = (Section *)(this->sections).space;
  (this->sections).numActive = 0;
  (this->sections).numAllocated = 8;
  uVar1 = (this->fullPath)._M_string_length;
  uVar3 = 0;
  while( true ) {
    if (uVar1 <= uVar3) {
      return;
    }
    sVar2 = std::__cxx11::string::find((char *)this,0x2a2866);
    if (sVar2 == 0xffffffffffffffff) break;
    if (sVar2 == 0) {
      throwInternalCompilerError("nextBreak != 0","TokenisedPathString",0x7d);
    }
    local_40.start = uVar3;
    local_40.end = sVar2;
    ArrayWithPreallocation<soul::TokenisedPathString::Section,_8UL>::push_back
              (&this->sections,&local_40);
    uVar3 = sVar2 + 2;
  }
  local_40.start = uVar3;
  local_40.end = uVar1;
  ArrayWithPreallocation<soul::TokenisedPathString::Section,_8UL>::push_back
            (&this->sections,&local_40);
  return;
}

Assistant:

TokenisedPathString (std::string path) : fullPath (std::move (path))
    {
        size_t currentSectionStart = 0;
        auto length = fullPath.length();

        while (currentSectionStart < length)
        {
            auto nextBreak = fullPath.find ("::", currentSectionStart);
            SOUL_ASSERT (nextBreak != 0);

            if (nextBreak == std::string::npos)
            {
                sections.push_back ({ currentSectionStart, length });
                break;
            }

            sections.push_back ({ currentSectionStart, nextBreak });
            currentSectionStart = nextBreak + 2;
        }
    }